

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

void Bmc_SuperBuildTents_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vIns,Vec_Int_t *vCuts,Vec_Int_t *vFlops,
               Vec_Int_t *vObjs,Vec_Int_t *vRankIns,Vec_Int_t *vRankCuts,int Rank)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  
  if ((iObj != 0) && (iVar2 = Gia_ObjIsTravIdCurrentId(p,iObj), iVar2 == 0)) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj = Gia_ManObj(p,iObj);
    uVar1 = *(ulong *)pObj;
    if (((uint)uVar1 >> 0x1e & 1) == 0) {
      *(ulong *)pObj = uVar1 | 0x40000000;
      iVar2 = Gia_ObjIsPi(p,pObj);
      if (iVar2 == 0) {
        uVar3 = (uint)*(undefined8 *)pObj;
        if ((~uVar3 & 0x9fffffff) != 0) {
          if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                          ,0x8a,
                          "void Bmc_SuperBuildTents_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          Bmc_SuperBuildTents_rec
                    (p,iObj - (uVar3 & 0x1fffffff),vIns,vCuts,vFlops,vObjs,vRankIns,vRankCuts,Rank);
          Bmc_SuperBuildTents_rec
                    (p,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),vIns,vCuts,vFlops,vObjs,
                     vRankIns,vRankCuts,Rank);
          vFlops = vObjs;
        }
        Vec_IntPush(vFlops,iObj);
        return;
      }
      Vec_IntPush(vIns,iObj);
      Vec_IntPush(vRankIns,Rank);
      pObj->field_0x7 = pObj->field_0x7 | 0x40;
    }
    else if ((uVar1 >> 0x3e & 1) != 0) {
      Vec_IntPush(vCuts,iObj);
      Vec_IntPush(vRankCuts,Rank);
      *(ulong *)pObj = *(ulong *)pObj | 0x4000000000000000;
    }
  }
  return;
}

Assistant:

void Bmc_SuperBuildTents_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vIns, Vec_Int_t * vCuts, Vec_Int_t * vFlops, Vec_Int_t * vObjs, Vec_Int_t * vRankIns, Vec_Int_t * vRankCuts, int Rank )
{
    Gia_Obj_t * pObj;
    if ( iObj == 0 )
        return;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark0 )
    {
        if ( !pObj->fMark1 )
            return;
        Vec_IntPush( vCuts, iObj );
        Vec_IntPush( vRankCuts, Rank );
        pObj->fMark1 = 1;
        return;
    }
    pObj->fMark0 = 1;
    if ( Gia_ObjIsPi(p, pObj) )
    {
        Vec_IntPush( vIns, iObj );
        Vec_IntPush( vRankIns, Rank );
        pObj->fMark1 = 1;
        return;
    }
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vFlops, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Bmc_SuperBuildTents_rec( p, Gia_ObjFaninId0(pObj, iObj), vIns, vCuts, vFlops, vObjs, vRankIns, vRankCuts, Rank );
    Bmc_SuperBuildTents_rec( p, Gia_ObjFaninId1(pObj, iObj), vIns, vCuts, vFlops, vObjs, vRankIns, vRankCuts, Rank );
    Vec_IntPush( vObjs, iObj );
}